

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_store_block(MACROBLOCKD *xd,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  TX_SIZE tx_size_00;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int col;
  int row;
  
  row = 0;
  col = 0;
  uVar4 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  if (((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0) ||
     ((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0)) {
    sub8x8_adjust_offset(&xd->cfl,xd->mi_row,xd->mi_col,&row,&col);
  }
  uVar3 = (uint)block_size_wide[uVar4];
  if (xd->mb_to_right_edge < 0) {
    uVar3 = (uint)block_size_wide[uVar4] +
            (xd->mb_to_right_edge >> ((char)xd->plane[0].subsampling_x + 3U & 0x1f));
  }
  uVar5 = -1 << (*(byte *)(tx_size_wide_log2 + tx_size) & 0x1f);
  uVar5 = ~uVar5 + (uVar3 & 0xfffffffc) & uVar5;
  uVar3 = (uint)block_size_high[uVar4];
  if (xd->mb_to_bottom_edge < 0) {
    uVar3 = (uint)block_size_high[uVar4] +
            (xd->mb_to_bottom_edge >> ((char)xd->plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar2 = -1 << (*(byte *)(tx_size_high_log2 + tx_size) & 0x1f);
  uVar2 = ~uVar2 + (uVar3 & 0xfffffffc) & uVar2;
  if (uVar5 == uVar2) {
    if (uVar5 == 8) {
      tx_size_00 = '\x01';
      goto LAB_0032a4f8;
    }
    if (uVar5 == 0x10) {
      tx_size_00 = '\x02';
      goto LAB_0032a4f8;
    }
    tx_size_00 = '\x04';
    if ((uVar5 == 0x80) || (uVar5 == 0x40)) goto LAB_0032a4f8;
    if (uVar5 == 0x20) {
      tx_size_00 = '\x03';
      goto LAB_0032a4f8;
    }
  }
  else if ((int)uVar5 < (int)uVar2) {
    if (uVar5 * 2 == uVar2) {
      uVar3 = uVar5 - 4 >> 2;
      if ((uVar5 << 0x1e | uVar3) < 8) {
        bVar1 = (byte)(uVar3 << 3);
        uVar4 = 0xb00000009000705;
LAB_0032a4ab:
        tx_size_00 = (TX_SIZE)(uVar4 >> (bVar1 & 0x3f));
        goto LAB_0032a4f8;
      }
    }
    else {
      if (uVar5 == 4) {
        tx_size_00 = '\r';
        goto LAB_0032a4f8;
      }
      if (uVar5 == 0x10) {
        tx_size_00 = '\x11';
        goto LAB_0032a4f8;
      }
      if (uVar5 == 8) {
        tx_size_00 = '\x0f';
        goto LAB_0032a4f8;
      }
    }
  }
  else if (uVar2 * 2 == uVar5) {
    uVar3 = uVar2 - 4 >> 2;
    if ((uVar2 << 0x1e | uVar3) < 8) {
      bVar1 = (byte)(uVar3 << 3);
      uVar4 = 0xc0000000a000806;
      goto LAB_0032a4ab;
    }
  }
  else {
    if (uVar2 == 4) {
      tx_size_00 = '\x0e';
      goto LAB_0032a4f8;
    }
    if (uVar2 == 0x10) {
      tx_size_00 = '\x12';
      goto LAB_0032a4f8;
    }
    if (uVar2 == 8) {
      tx_size_00 = '\x10';
      goto LAB_0032a4f8;
    }
  }
  tx_size_00 = '\0';
LAB_0032a4f8:
  cfl_store(&xd->cfl,xd->plane[0].dst.buf,xd->plane[0].dst.stride,row,col,tx_size_00,
            (uint)xd->cur_buf->flags >> 3 & 1);
  return;
}

Assistant:

void cfl_store_block(MACROBLOCKD *const xd, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int row = 0;
  int col = 0;

  if (block_size_high[bsize] == 4 || block_size_wide[bsize] == 4) {
    sub8x8_adjust_offset(cfl, xd->mi_row, xd->mi_col, &row, &col);
  }
  const int width = max_intra_block_width(xd, bsize, AOM_PLANE_Y, tx_size);
  const int height = max_intra_block_height(xd, bsize, AOM_PLANE_Y, tx_size);
  tx_size = get_tx_size(width, height);
  cfl_store(cfl, pd->dst.buf, pd->dst.stride, row, col, tx_size,
            is_cur_buf_hbd(xd));
}